

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdPrimvarReader_float *shader,
          uint32_t indent)

{
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *attr;
  TypedAttribute<tinyusdz::Animatable<float>_> *attr_00;
  TypedTerminalAttribute<float> *attr_01;
  uint32_t indent_00;
  string local_2a0;
  allocator local_279;
  string local_278;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  UsdPrimvarReader_float *shader_local;
  
  local_1c = (uint32_t)shader;
  ptStack_18 = this;
  shader_local = (UsdPrimvarReader_float *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  attr = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(ptStack_18 + 0x990);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_1e8,"inputs:varname",&local_1e9);
  print_str_attr(&local_1c8,attr,&local_1e8,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  attr_00 = (TypedAttribute<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x730);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_230,"inputs:fallback",&local_231);
  print_typed_attr<float>(&local_210,attr_00,&local_230,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_210);
  ::std::__cxx11::string::~string((string *)&local_230);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
  attr_01 = (TypedTerminalAttribute<float> *)(ptStack_18 + 0xc10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_278,"outputs:result",&local_279);
  indent_00 = local_1c;
  print_typed_terminal_attr<float>(&local_258,attr_01,&local_278,local_1c);
  ::std::operator<<(aoStack_198,(string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_278);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
  print_common_shader_params_abi_cxx11_
            (&local_2a0,ptStack_18,(ShaderNode *)(ulong)local_1c,indent_00);
  ::std::operator<<(aoStack_198,(string *)&local_2a0);
  ::std::__cxx11::string::~string((string *)&local_2a0);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string print_shader_params(const UsdPrimvarReader_float &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_str_attr(shader.varname, "inputs:varname", indent);
  ss << print_typed_attr(shader.fallback, "inputs:fallback", indent);
  ss << print_typed_terminal_attr(shader.result, "outputs:result", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}